

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Maybe<kj::Own<capnp::_::SegmentReader>_&> __thiscall
kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
          (HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *this,uint *key)

{
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry_&> MVar1;
  
  MVar1 = Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>>
          ::find<0ul,unsigned_int&>
                    ((Table<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>>
                      *)this,key);
  if (MVar1.ptr != (Entry *)0x0) {
    MVar1.ptr = (Entry *)&(MVar1.ptr)->value;
  }
  return (Maybe<kj::Own<capnp::_::SegmentReader>_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}